

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# combinator.hpp
# Opt level: O3

result<toml::detail::region,_toml::detail::none_t> * __thiscall
toml::detail::
sequence<toml::detail::repeat<toml::detail::in_range<(char)48,(char)57>,toml::detail::exactly<2ul>>,toml::detail::maybe<toml::detail::sequence<toml::detail::character<(char)46>,toml::detail::repeat<toml::detail::in_range<(char)48,(char)57>,toml::detail::at_least<1ul>>>>>
::invoke<__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>>
          (result<toml::detail::region,_toml::detail::none_t> *__return_storage_ptr__,
          sequence<toml::detail::repeat<toml::detail::in_range<(char)48,(char)57>,toml::detail::exactly<2ul>>,toml::detail::maybe<toml::detail::sequence<toml::detail::character<(char)46>,toml::detail::repeat<toml::detail::in_range<(char)48,(char)57>,toml::detail::at_least<1ul>>>>>
          *this,location *loc,region *reg,
          __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> first)

{
  size_type *psVar1;
  value_type *other;
  result<toml::detail::region,_toml::detail::none_t> rslt;
  undefined1 local_c0 [48];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_90;
  const_iterator cStack_80;
  result<toml::detail::region,_toml::detail::none_t> local_78;
  
  repeat<toml::detail::in_range<'0',_'9'>,_toml::detail::exactly<2UL>_>::invoke
            (&local_78,(location *)this);
  if (local_78.is_ok_ == false) {
    location::reset((location *)this,(const_iterator)reg);
    __return_storage_ptr__->is_ok_ = false;
  }
  else {
    other = result<toml::detail::region,_toml::detail::none_t>::unwrap(&local_78);
    region::operator+=((region *)loc,other);
    local_c0._24_8_ = local_c0 + 0x28;
    local_c0._0_8_ = &PTR__region_001c5698;
    local_c0._8_8_ =
         (loc->source_).
         super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
         ._M_ptr;
    local_c0._16_8_ =
         (loc->source_).
         super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi;
    (loc->source_).
    super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (loc->source_).
    super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
    psVar1 = &(loc->source_name_)._M_string_length;
    if ((size_type *)loc->line_number_ == psVar1) {
      local_c0._40_8_ = *psVar1;
      aStack_90._M_allocated_capacity = (loc->source_name_).field_2._M_allocated_capacity;
    }
    else {
      local_c0._40_8_ = *psVar1;
      local_c0._24_8_ = (pointer)loc->line_number_;
    }
    local_c0._32_8_ = (loc->source_name_)._M_dataplus._M_p;
    loc->line_number_ = (size_t)psVar1;
    (loc->source_name_)._M_dataplus._M_p = (pointer)0x0;
    *(undefined1 *)&(loc->source_name_)._M_string_length = 0;
    aStack_90._8_8_ = *(undefined8 *)((long)&(loc->source_name_).field_2 + 8);
    cStack_80._M_current = (loc->iter_)._M_current;
    sequence<toml::detail::maybe<toml::detail::sequence<toml::detail::character<(char)46>,toml::detail::repeat<toml::detail::in_range<(char)48,(char)57>,toml::detail::at_least<1ul>>>>>
    ::invoke<__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>>
              (__return_storage_ptr__,
               (sequence<toml::detail::maybe<toml::detail::sequence<toml::detail::character<(char)46>,toml::detail::repeat<toml::detail::in_range<(char)48,(char)57>,toml::detail::at_least<1ul>>>>>
                *)this,(location *)local_c0,reg,first);
    region::~region((region *)local_c0);
  }
  if (local_78.is_ok_ == true) {
    region::~region(&local_78.field_1.succ.value);
  }
  return __return_storage_ptr__;
}

Assistant:

static result<region, none_t>
    invoke(location& loc, region reg, Iterator first)
    {
        const auto rslt = Head::invoke(loc);
        if(rslt.is_err())
        {
            loc.reset(first);
            return none();
        }
        reg += rslt.unwrap(); // concat regions
        return sequence<Tail...>::invoke(loc, std::move(reg), first);
    }